

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

char * Gia_ObjGetDumpName(Vec_Ptr_t *vNames,char c,int i,int d)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  
  if (vNames == (Vec_Ptr_t *)0x0) {
    sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)(uint)(int)c,
            CONCAT44(in_register_0000000c,d),(ulong)(uint)i,(ulong)(uint)(int)c);
  }
  else {
    if ((i < 0) || (vNames->nSize <= i)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pcVar2 = (char *)vNames->pArray[(uint)i];
    iVar1 = Gia_ManNameIsLegalInVerilog(pcVar2);
    if (iVar1 != 0) {
      pcVar2 = strcpy(Gia_ObjGetDumpName::pBuffer,pcVar2);
      return pcVar2;
    }
    sprintf(Gia_ObjGetDumpName::pBuffer,"\\%s ",pcVar2);
  }
  return Gia_ObjGetDumpName::pBuffer;
}

Assistant:

char * Gia_ObjGetDumpName( Vec_Ptr_t * vNames, char c, int i, int d )
{
    static char pBuffer[10000];
    if ( vNames )
    {
        char * pName = (char *)Vec_PtrEntry(vNames, i);
        if ( Gia_ManNameIsLegalInVerilog(pName) )
            sprintf( pBuffer, "%s", pName );
        else
            sprintf( pBuffer, "\\%s ", pName );
    }
    else
        sprintf( pBuffer, "%c%0*d%c", c, d, i, c );
    return pBuffer;
}